

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O2

Promise<kj::AuthenticatedStream> __thiscall
kj::TlsContext::wrapServer(TlsContext *this,AuthenticatedStream *stream)

{
  Disposer *pDVar1;
  PromiseArena *pPVar2;
  _func_int *p_Var3;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> OVar4;
  char *pcVar5;
  SecureNetworkWrapper SVar6;
  void *pvVar7;
  socklen_t *in_RCX;
  Own<kj::AsyncIoStream,_std::nullptr_t> *in_RDX;
  void **in_R8;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:968:23)>
  *pSVar8;
  TransformPromiseNodeBase *this_00;
  Own<kj::TlsConnection,_std::nullptr_t> OVar9;
  Promise<void> promise;
  void *continuationTracePtr_1;
  OwnPromiseNode intermediate_1;
  OwnPromiseNode intermediate;
  Own<kj::TlsConnection,_std::nullptr_t> conn;
  String peerId;
  undefined1 local_f0 [16];
  OwnPromiseNode local_e0;
  OwnPromiseNode local_d8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_d0;
  anon_class_32_2_93c5e707_for_func local_c8;
  Array<char> local_a8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_90;
  char *pcStack_88;
  byte local_80 [8];
  Own<kj::TlsConnection,_std::nullptr_t> local_78;
  Array<char> local_68;
  SecureNetworkWrapper local_48;
  char *local_40;
  char *pcStack_38;
  byte local_30 [8];
  
  local_c8.conn.disposer = (Disposer *)(stream->stream).ptr;
  OVar9 = heap<kj::TlsConnection,kj::Own<kj::AsyncIoStream,decltype(nullptr)>,ssl_ctx_st*>
                    ((kj *)&local_78,in_RDX,(ssl_ctx_st **)&local_c8);
  TlsConnection::accept((TlsConnection *)local_f0,(int)local_78.ptr,(sockaddr *)OVar9.ptr,in_RCX);
  if (*(char *)&(stream->peerIdentity).ptr == '\x01') {
    pDVar1 = (stream->peerIdentity).disposer;
    if (pDVar1 == (Disposer *)0x0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&local_c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
                 ,0x3c3,FAILED,"timer != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)&local_c8);
    }
    (*pDVar1->_vptr_Disposer[2])(&local_e0,pDVar1,stream[1].stream.disposer);
    pPVar2 = ((local_e0.ptr)->super_PromiseArenaMember).arena;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_e0.ptr - (long)pPVar2) < 0x28) {
      pvVar7 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar7 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_e0,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:963:66)>
                 ::anon_class_1_0_00000001_for_func::operator());
      *(undefined ***)((long)pvVar7 + 0x3d8) = &PTR_destroy_0059edc8;
      *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
    }
    else {
      ((local_e0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)((SSL *)(local_e0.ptr + -3) + 8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_e0,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:963:66)>
                 ::anon_class_1_0_00000001_for_func::operator());
      *(undefined ***)((SSL *)(local_e0.ptr + -3) + 8) = &PTR_destroy_0059edc8;
      *(PromiseArena **)(local_e0.ptr + -2) = pPVar2;
    }
    local_c8.conn.disposer = (Disposer *)&DAT_003d3151;
    local_c8.conn.ptr = (TlsConnection *)&DAT_003d31b0;
    local_c8.innerId.disposer = (Disposer *)0x4c0000058b;
    location.function = &DAT_003d31b0;
    location.fileName = &DAT_003d3151;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    local_90.ptr = &this_00->super_PromiseNode;
    kj::_::maybeChain<void>((OwnPromiseNode *)&local_a8,(Promise<void> *)&local_90,location);
    pcVar5 = local_a8.ptr;
    local_a8.ptr = (char *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_a8);
    local_d8.ptr = (PromiseNode *)pcVar5;
    local_68.ptr = (char *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_68);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_90);
    local_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
    ;
    pcStack_38 = "wrapServer";
    local_30[0] = 0xc3;
    local_30[1] = '\x03';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_30[4] = '\'';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    location_00.function = "wrapServer";
    location_00.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
    ;
    location_00.lineNumber = 0x3c3;
    location_00.columnNumber = 0x27;
    Promise<void>::exclusiveJoin
              ((Promise<void> *)(local_f0 + 8),(Promise<void> *)&local_d8,location_00);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_f0,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_f0 + 8));
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_f0 + 8));
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_d8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_e0);
  }
  (**((in_RDX[1].ptr)->super_AsyncInputStream)._vptr_AsyncInputStream)(&local_68);
  local_c8.conn.disposer = local_78.disposer;
  local_c8.conn.ptr = local_78.ptr;
  local_78.ptr = (TlsConnection *)0x0;
  local_c8.innerId.disposer = *(Disposer **)(in_RDX + 1);
  local_c8.innerId.ptr = (PeerIdentity *)in_RDX[1].ptr;
  in_RDX[1].ptr = (AsyncIoStream *)0x0;
  local_90.ptr = (PromiseNode *)
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:968:23)>
                 ::anon_class_32_2_93c5e707_for_func::operator();
  p_Var3 = *(_func_int **)(local_f0._0_8_ + 8);
  if (p_Var3 == (_func_int *)0x0 || (ulong)(local_f0._0_8_ - (long)p_Var3) < 0x40) {
    pvVar7 = operator_new(0x400);
    pSVar8 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:968:23)>
              *)((long)pvVar7 + 0x3c0);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::TlsContext::wrapServer(kj::AuthenticatedStream)::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::TlsContext::wrapServer(kj::AuthenticatedStream)::__1,void*&>
              (pSVar8,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_f0,&local_c8,
               &local_90.ptr);
    *(void **)((long)pvVar7 + 0x3c8) = pvVar7;
  }
  else {
    *(_func_int **)(local_f0._0_8_ + 8) = (_func_int *)0x0;
    pSVar8 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:968:23)>
              *)(local_f0._0_8_ + -0x40);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::TlsContext::wrapServer(kj::AuthenticatedStream)::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::TlsContext::wrapServer(kj::AuthenticatedStream)::__1,void*&>
              (pSVar8,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_f0,&local_c8,
               &local_90.ptr);
    *(_func_int **)(local_f0._0_8_ + -0x38) = p_Var3;
  }
  local_a8.ptr = (char *)0x0;
  local_f0._8_8_ = (_func_int **)0x0;
  local_d0.ptr = (PromiseNode *)pSVar8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_f0 + 8));
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_a8);
  OVar4.ptr = local_d0.ptr;
  local_a8.ptr = local_68.ptr;
  local_a8.size_ = local_68.size_;
  local_a8.disposer = local_68.disposer;
  local_68.ptr = (char *)0x0;
  local_68.size_ = 0;
  local_90.ptr = (PromiseNode *)0x45471e;
  pcStack_88 = "wrapServer";
  local_80[0] = 200;
  local_80[1] = '\x03';
  local_80[2] = '\0';
  local_80[3] = '\0';
  local_80[4] = '\n';
  local_80[5] = '\0';
  local_80[6] = '\0';
  local_80[7] = '\0';
  local_f0._8_8_ =
       kj::_::
       TransformPromiseNode<kj::AuthenticatedStream,_kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:971:13)>
       ::anon_class_24_1_66019b5b_for_errorHandler::operator();
  pPVar2 = (((TransformPromiseNodeBase *)&(local_d0.ptr)->super_PromiseArenaMember)->
           super_PromiseNode).super_PromiseArenaMember.arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_d0.ptr - (long)pPVar2) < 0x40) {
    pvVar7 = operator_new(0x400);
    pSVar8 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:968:23)>
              *)((long)pvVar7 + 0x3c0);
    ctor<kj::_::TransformPromiseNode<kj::AuthenticatedStream,kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>>,kj::TlsContext::wrapServer(kj::AuthenticatedStream)::__2>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>>,kj::TlsContext::wrapServer(kj::AuthenticatedStream)::__2,void*&>
              ((TransformPromiseNode<kj::AuthenticatedStream,_kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:971:13)>
                *)pSVar8,&local_d0,(IdentityFunc<kj::Promise<kj::AuthenticatedStream>_> *)&local_a8,
               (anon_class_24_1_66019b5b_for_errorHandler *)(local_f0 + 8),in_R8);
    *(void **)((long)pvVar7 + 0x3c8) = pvVar7;
  }
  else {
    (((TransformPromiseNodeBase *)&(local_d0.ptr)->super_PromiseArenaMember)->super_PromiseNode).
    super_PromiseArenaMember.arena = (PromiseArena *)0x0;
    pSVar8 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:968:23)>
              *)(local_d0.ptr + -4);
    ctor<kj::_::TransformPromiseNode<kj::AuthenticatedStream,kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>>,kj::TlsContext::wrapServer(kj::AuthenticatedStream)::__2>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>>,kj::TlsContext::wrapServer(kj::AuthenticatedStream)::__2,void*&>
              ((TransformPromiseNode<kj::AuthenticatedStream,_kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:971:13)>
                *)pSVar8,&local_d0,(IdentityFunc<kj::Promise<kj::AuthenticatedStream>_> *)&local_a8,
               (anon_class_24_1_66019b5b_for_errorHandler *)(local_f0 + 8),in_R8);
    (((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:968:23)>
       *)(OVar4.ptr + -4))->super_TransformPromiseNodeBase).super_PromiseNode.
    super_PromiseArenaMember.arena = pPVar2;
  }
  location_01.function = pcStack_88;
  location_01.fileName = (char *)local_90.ptr;
  location_01._16_8_ = local_80;
  local_d8.ptr = (PromiseNode *)pSVar8;
  kj::_::maybeChain<kj::AuthenticatedStream>
            ((OwnPromiseNode *)&local_48,(Promise<kj::AuthenticatedStream> *)&local_d8,location_01);
  SVar6._vptr_SecureNetworkWrapper = local_48._vptr_SecureNetworkWrapper;
  local_48._vptr_SecureNetworkWrapper = (_func_int **)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_48);
  (this->super_SecureNetworkWrapper)._vptr_SecureNetworkWrapper = SVar6._vptr_SecureNetworkWrapper;
  local_e0.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_e0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_d8);
  Array<char>::~Array(&local_a8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_d0);
  wrapServer(kj::AuthenticatedStream)::$_1::~__1((__1 *)&local_c8);
  Array<char>::~Array(&local_68);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_f0);
  Own<kj::TlsConnection,_std::nullptr_t>::dispose(&local_78);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::AuthenticatedStream> TlsContext::wrapServer(kj::AuthenticatedStream stream) {
  auto conn = kj::heap<TlsConnection>(kj::mv(stream.stream), reinterpret_cast<SSL_CTX*>(ctx));
  auto promise = conn->accept();
  KJ_IF_SOME(timeout, acceptTimeout) {
    promise = KJ_REQUIRE_NONNULL(timer).afterDelay(timeout).then([]() -> kj::Promise<void> {
      return KJ_EXCEPTION(DISCONNECTED, "timed out waiting for client during TLS handshake");
    }).exclusiveJoin(kj::mv(promise));
  }
  auto peerId = stream.peerIdentity->toString();
  return promise.then([conn=kj::mv(conn),innerId=kj::mv(stream.peerIdentity)]() mutable {
    auto id = conn->getIdentity(kj::mv(innerId));
    return kj::AuthenticatedStream { kj::mv(conn), kj::mv(id) };
  }).catch_([peerId=kj::mv(peerId)](kj::Exception&& e) -> kj::Promise<kj::AuthenticatedStream> {
    e.setDescription(kj::str(e.getDescription(), "; clientId = ", peerId));
    kj::throwFatalException(kj::mv(e));
  });
}